

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O3

void __thiscall
QBalloonTip::QBalloonTip
          (QBalloonTip *this,QIcon *icon,QString *title,QString *message,QSystemTrayIcon *ti)

{
  QWidgetTextControl *this_00;
  double dVar1;
  int w;
  char cVar2;
  int iVar3;
  QWidget *this_01;
  QWidget *this_02;
  QStyle *pQVar4;
  QWidget *widget;
  QTextDocument *pQVar5;
  QLayout *this_03;
  QWidget *this_04;
  QPalette *pQVar6;
  ColorGroup CVar7;
  long in_FS_OFFSET;
  QRect QVar8;
  QTextOption opt;
  QObject local_90 [8];
  QObject local_88 [8];
  QBrush local_80 [8];
  QColor local_78;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,(QWidget *)0x0,(WindowFlags)0xd);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007ea438;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QBalloonTip_007ea5e8;
  this->trayIcon = ti;
  QPixmap::QPixmap(&this->pixmap);
  (this->timer).m_id = Invalid;
  this->showArrow = true;
  QWidget::setAttribute(&this->super_QWidget,WA_DeleteOnClose,true);
  QObject::connect(local_88,(char *)ti,(QObject *)"2destroyed()",(char *)this,0x672216);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  this_01 = (QWidget *)operator_new(0x28);
  QLabel::QLabel((QLabel *)this_01,(QWidget *)0x0,(WindowFlags)0x0);
  QObject::installEventFilter((QObject *)this_01);
  QLabel::setText((QLabel *)this_01,title);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)&local_48,&this_01->data->fnt);
  QFont::setWeight((Weight)(QFont *)&local_48);
  QWidget::setFont(this_01,(QFont *)&local_48);
  QLabel::setTextFormat((QLabel *)this_01,PlainText);
  this_02 = (QWidget *)operator_new(0x28);
  QPushButton::QPushButton((QPushButton *)this_02,(QWidget *)0x0);
  pQVar4 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar4 + 0x100))((QIcon *)local_68,pQVar4,3,0,0);
  QAbstractButton::setIcon((QAbstractButton *)this_02,(QIcon *)local_68);
  QIcon::~QIcon((QIcon *)local_68);
  local_68._0_4_ = 0xf;
  local_68._4_4_ = 0xf;
  QAbstractButton::setIconSize((QAbstractButton *)this_02,(QSize *)local_68);
  QWidget::setSizePolicy(this_02,(QSizePolicy)0x0);
  QWidget::setFixedSize(this_02,0xf,0xf);
  QObject::connect(local_90,(char *)this_02,(QObject *)"2clicked()",(char *)this,0x672216);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  widget = (QWidget *)operator_new(0x28);
  QLabel::QLabel((QLabel *)widget,(QWidget *)0x0,(WindowFlags)0x0);
  QObject::installEventFilter((QObject *)widget);
  QLabel::setText((QLabel *)widget,message);
  QLabel::setTextFormat((QLabel *)widget,PlainText);
  QLabel::setAlignment((QLabel *)widget,(Alignment)0x21);
  QVar8 = QWidgetPrivate::availableScreenGeometry(widget);
  w = ((QVar8.x2.m_i.m_i - QVar8.x1.m_i) + 1) / 3;
  iVar3 = (**(code **)(*(long *)widget + 0x70))(widget);
  if (w < iVar3) {
    QLabel::setWordWrap((QLabel *)widget,true);
    iVar3 = (**(code **)(*(long *)widget + 0x70))(widget);
    if (w < iVar3) {
      QLabelPrivate::ensureTextControl(*(QLabelPrivate **)&widget->field_0x8);
      this_00 = *(QWidgetTextControl **)(*(long *)&widget->field_0x8 + 0x2f8);
      if (this_00 != (QWidgetTextControl *)0x0) {
        local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        uStack_60._0_4_ = ~Active;
        uStack_60._4_4_ = 0xffffffff;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        QWidgetTextControl::document(this_00);
        QTextDocument::defaultTextOption();
        local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffe1ff | 0x600);
        pQVar5 = QWidgetTextControl::document(this_00);
        QTextDocument::setDefaultTextOption((QTextOption *)pQVar5);
        QTextOption::~QTextOption((QTextOption *)local_68);
      }
    }
    iVar3 = (**(code **)(*(long *)widget + 0x80))(widget,w);
    QWidget::setFixedSize(widget,w,iVar3);
  }
  this_03 = (QLayout *)operator_new(0x20);
  QGridLayout::QGridLayout((QGridLayout *)this_03,(QWidget *)0x0);
  cVar2 = QIcon::isNull();
  if (cVar2 == '\0') {
    this_04 = (QWidget *)operator_new(0x28);
    QLabel::QLabel((QLabel *)this_04,(QWidget *)0x0,(WindowFlags)0x0);
    local_78.cspec = 0x12;
    local_78.ct._0_4_ = 0x12;
    dVar1 = (double)QPaintDevice::devicePixelRatio();
    QIcon::pixmap((QSize *)local_68,dVar1,(Mode)icon,(State)&local_78);
    QLabel::setPixmap((QLabel *)this_04,(QPixmap *)local_68);
    QPixmap::~QPixmap((QPixmap *)local_68);
    QWidget::setSizePolicy(this_04,(QSizePolicy)0x0);
    QLabel::setMargin((QLabel *)this_04,2);
    QGridLayout::addWidget((QGridLayout *)this_03,this_04,0,0,(Alignment)0x0);
    QGridLayout::addWidget((QGridLayout *)this_03,this_01,0,1,(Alignment)0x0);
  }
  else {
    QGridLayout::addWidget((QGridLayout *)this_03,this_01,0,0,1,2,(Alignment)0x0);
  }
  QGridLayout::addWidget((QGridLayout *)this_03,this_02,0,2,(Alignment)0x0);
  QGridLayout::addWidget((QGridLayout *)this_03,widget,1,0,1,3,(Alignment)0x0);
  QLayout::setSizeConstraint(this_03,SetFixedSize);
  QLayout::setContentsMargins(this_03,3,3,3,3);
  QWidget::setLayout(&this->super_QWidget,this_03);
  local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = QWidget::palette(&this->super_QWidget);
  QPalette::QPalette((QPalette *)local_68,pQVar6);
  local_78.cspec = Rgb;
  local_78.ct._0_4_ = 0xffffffff;
  local_78.ct._4_4_ = 0xe1e1ffff;
  local_78.ct.argb.pad = 0;
  QBrush::QBrush(local_80,&local_78,SolidPattern);
  CVar7 = (ColorGroup)(QPalette *)local_68;
  QPalette::setBrush(CVar7,Mid,(QBrush *)&DAT_0000000a);
  QBrush::~QBrush(local_80);
  QColor::QColor(&local_78,black);
  QBrush::QBrush(local_80,&local_78,SolidPattern);
  QPalette::setBrush(CVar7,Mid,(QBrush *)0x0);
  QBrush::~QBrush(local_80);
  QWidget::setPalette(&this->super_QWidget,(QPalette *)local_68);
  QPalette::~QPalette((QPalette *)local_68);
  QFont::~QFont((QFont *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QBalloonTip::QBalloonTip(const QIcon &icon, const QString &title,
                         const QString &message, QSystemTrayIcon *ti)
    : QWidget(nullptr, Qt::ToolTip),
      trayIcon(ti),
      showArrow(true)
{
    setAttribute(Qt::WA_DeleteOnClose);
    QObject::connect(ti, SIGNAL(destroyed()), this, SLOT(close()));

#if QT_CONFIG(label)
    QLabel *titleLabel = new QLabel;
    titleLabel->installEventFilter(this);
    titleLabel->setText(title);
    QFont f = titleLabel->font();
    f.setBold(true);
    titleLabel->setFont(f);
    titleLabel->setTextFormat(Qt::PlainText); // to maintain compat with windows
#endif

    const int iconSize = 18;
    const int closeButtonSize = 15;

#if QT_CONFIG(pushbutton)
    QPushButton *closeButton = new QPushButton;
    closeButton->setIcon(style()->standardIcon(QStyle::SP_TitleBarCloseButton));
    closeButton->setIconSize(QSize(closeButtonSize, closeButtonSize));
    closeButton->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed);
    closeButton->setFixedSize(closeButtonSize, closeButtonSize);
    QObject::connect(closeButton, SIGNAL(clicked()), this, SLOT(close()));
#else
    Q_UNUSED(closeButtonSize);
#endif

#if QT_CONFIG(label)
    QLabel *msgLabel = new QLabel;
    msgLabel->installEventFilter(this);
    msgLabel->setText(message);
    msgLabel->setTextFormat(Qt::PlainText);
    msgLabel->setAlignment(Qt::AlignTop | Qt::AlignLeft);

    // smart size for the message label
    int limit = QWidgetPrivate::availableScreenGeometry(msgLabel).width() / 3;
    if (msgLabel->sizeHint().width() > limit) {
        msgLabel->setWordWrap(true);
        if (msgLabel->sizeHint().width() > limit) {
            msgLabel->d_func()->ensureTextControl();
            if (QWidgetTextControl *control = msgLabel->d_func()->control) {
                QTextOption opt = control->document()->defaultTextOption();
                opt.setWrapMode(QTextOption::WrapAnywhere);
                control->document()->setDefaultTextOption(opt);
            }
        }
        // Here we allow the text being much smaller than the balloon widget
        // to emulate the weird standard windows behavior.
        msgLabel->setFixedSize(limit, msgLabel->heightForWidth(limit));
    }
#endif

    QGridLayout *layout = new QGridLayout;
#if QT_CONFIG(label)
    if (!icon.isNull()) {
        QLabel *iconLabel = new QLabel;
        iconLabel->setPixmap(icon.pixmap(QSize(iconSize, iconSize), devicePixelRatio()));
        iconLabel->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed);
        iconLabel->setMargin(2);
        layout->addWidget(iconLabel, 0, 0);
        layout->addWidget(titleLabel, 0, 1);
    } else {
        layout->addWidget(titleLabel, 0, 0, 1, 2);
    }
#endif

#if QT_CONFIG(pushbutton)
    layout->addWidget(closeButton, 0, 2);
#endif

#if QT_CONFIG(label)
    layout->addWidget(msgLabel, 1, 0, 1, 3);
#endif
    layout->setSizeConstraint(QLayout::SetFixedSize);
    layout->setContentsMargins(3, 3, 3, 3);
    setLayout(layout);

    QPalette pal = palette();
    pal.setColor(QPalette::Window, QColor(0xff, 0xff, 0xe1));
    pal.setColor(QPalette::WindowText, Qt::black);
    setPalette(pal);
}